

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disabled_tests_decl.cpp
# Opt level: O0

void __thiscall
iu_FooP_x_iutest_x_DISABLED_Bar_Test::iu_FooP_x_iutest_x_DISABLED_Bar_Test
          (iu_FooP_x_iutest_x_DISABLED_Bar_Test *this)

{
  iu_FooP_x_iutest_x_DISABLED_Bar_Test *this_local;
  
  FooP::FooP(&this->super_type);
  (this->super_type).super_TestWithParam<int>.super_Test._vptr_Test =
       (_func_int **)&PTR__iu_FooP_x_iutest_x_DISABLED_Bar_Test_00199108;
  (this->super_type).super_TestWithParam<int>.super_WithParamInterface<int>._vptr_WithParamInterface
       = (_func_int **)&PTR__iu_FooP_x_iutest_x_DISABLED_Bar_Test_00199148;
  return;
}

Assistant:

IUTEST_P(FooP, DISABLED_Bar)
{
    int v = GetParam();
    IUTEST_FAIL() << v;
}